

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cl_parser.cpp
# Opt level: O0

void __thiscall ClParser_Modifiers_Test::TestBody(ClParser_Modifiers_Test *this)

{
  bool bVar1;
  char *pcVar2;
  string *psVar3;
  AssertHelper local_8e0;
  Message local_8d8;
  allocator local_8c9;
  string local_8c8;
  desc local_8a8;
  opt<int,_pstore::command_line::parser<int,_void>_> local_888;
  undefined1 local_7d8 [8];
  AssertionResult gtest_ar_9;
  Message local_7c0;
  opt<int,_pstore::command_line::parser<int,_void>_> local_7b8;
  undefined1 local_708 [8];
  AssertionResult gtest_ar_8;
  Message local_6f0;
  opt<int,_pstore::command_line::parser<int,_void>_> local_6e8;
  undefined1 local_638 [8];
  AssertionResult gtest_ar_7;
  Message local_620;
  opt<int,_pstore::command_line::parser<int,_void>_> local_618;
  undefined1 local_568 [8];
  AssertionResult gtest_ar_6;
  Message local_550;
  num_occurrences_flag local_544;
  opt<int,_pstore::command_line::parser<int,_void>_> local_540;
  num_occurrences_flag local_48c;
  undefined1 local_488 [8];
  AssertionResult gtest_ar_5;
  Message local_470;
  num_occurrences_flag local_464;
  opt<int,_pstore::command_line::parser<int,_void>_> local_460;
  num_occurrences_flag local_3ac;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_4;
  Message local_390;
  num_occurrences_flag local_384;
  opt<int,_pstore::command_line::parser<int,_void>_> local_380;
  num_occurrences_flag local_2cc;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_3;
  Message local_2b0;
  num_occurrences_flag local_2a4;
  opt<int,_pstore::command_line::parser<int,_void>_> local_2a0;
  num_occurrences_flag local_1ec;
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar_2;
  Message local_1d0;
  num_occurrences_flag local_1c4;
  opt<int,_pstore::command_line::parser<int,_void>_> local_1c0;
  num_occurrences_flag local_10c;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_1;
  Message local_f0;
  num_occurrences_flag local_e8 [4];
  opt<int,_pstore::command_line::parser<int,_void>_> local_d8;
  num_occurrences_flag local_24;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ClParser_Modifiers_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::opt<>(&local_d8);
  local_24 = pstore::command_line::option::get_num_occurrences_flag(&local_d8.super_option);
  local_e8[0] = optional;
  testing::internal::EqHelper::
  Compare<pstore::command_line::num_occurrences_flag,_pstore::command_line::num_occurrences_flag,_nullptr>
            ((EqHelper *)local_20,"opt<int> ().get_num_occurrences_flag ()",
             "num_occurrences_flag::optional",&local_24,local_e8);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::~opt(&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(&local_f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x71,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::
  opt<pstore::command_line::details::optional>
            (&local_1c0,(optional *)&pstore::command_line::optional);
  local_10c = pstore::command_line::option::get_num_occurrences_flag(&local_1c0.super_option);
  local_1c4 = optional;
  testing::internal::EqHelper::
  Compare<pstore::command_line::num_occurrences_flag,_pstore::command_line::num_occurrences_flag,_nullptr>
            ((EqHelper *)local_108,"opt<int>{optional}.get_num_occurrences_flag ()",
             "num_occurrences_flag::optional",&local_10c,&local_1c4);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::~opt(&local_1c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_1d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x72,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::
  opt<pstore::command_line::details::required>
            (&local_2a0,(required *)&pstore::command_line::required);
  local_1ec = pstore::command_line::option::get_num_occurrences_flag(&local_2a0.super_option);
  local_2a4 = required;
  testing::internal::EqHelper::
  Compare<pstore::command_line::num_occurrences_flag,_pstore::command_line::num_occurrences_flag,_nullptr>
            ((EqHelper *)local_1e8,"opt<int>{required}.get_num_occurrences_flag ()",
             "num_occurrences_flag::required",&local_1ec,&local_2a4);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::~opt(&local_2a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x73,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_2b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::
  opt<pstore::command_line::details::one_or_more>
            (&local_380,(one_or_more *)&pstore::command_line::one_or_more);
  local_2cc = pstore::command_line::option::get_num_occurrences_flag(&local_380.super_option);
  local_384 = zero_or_more;
  testing::internal::EqHelper::
  Compare<pstore::command_line::num_occurrences_flag,_pstore::command_line::num_occurrences_flag,_nullptr>
            ((EqHelper *)local_2c8,"opt<int>{one_or_more}.get_num_occurrences_flag ()",
             "num_occurrences_flag::zero_or_more",&local_2cc,&local_384);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::~opt(&local_380);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2c8);
  if (!bVar1) {
    testing::Message::Message(&local_390);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x75,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_390);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_390);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
  pstore::command_line::opt<int,pstore::command_line::parser<int,void>>::
  opt<pstore::command_line::details::required,pstore::command_line::details::one_or_more>
            ((opt<int,pstore::command_line::parser<int,void>> *)&local_460,
             (required *)&pstore::command_line::required,
             (one_or_more *)&pstore::command_line::one_or_more);
  local_3ac = pstore::command_line::option::get_num_occurrences_flag(&local_460.super_option);
  local_464 = one_or_more;
  testing::internal::EqHelper::
  Compare<pstore::command_line::num_occurrences_flag,_pstore::command_line::num_occurrences_flag,_nullptr>
            ((EqHelper *)local_3a8,"opt<int> (required, one_or_more).get_num_occurrences_flag ()",
             "num_occurrences_flag::one_or_more",&local_3ac,&local_464);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::~opt(&local_460);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_470);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x77,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_470);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_470);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
  pstore::command_line::opt<int,pstore::command_line::parser<int,void>>::
  opt<pstore::command_line::details::optional,pstore::command_line::details::one_or_more>
            ((opt<int,pstore::command_line::parser<int,void>> *)&local_540,
             (optional *)&pstore::command_line::optional,
             (one_or_more *)&pstore::command_line::one_or_more);
  local_48c = pstore::command_line::option::get_num_occurrences_flag(&local_540.super_option);
  local_544 = zero_or_more;
  testing::internal::EqHelper::
  Compare<pstore::command_line::num_occurrences_flag,_pstore::command_line::num_occurrences_flag,_nullptr>
            ((EqHelper *)local_488,"opt<int> (optional, one_or_more).get_num_occurrences_flag ()",
             "num_occurrences_flag::zero_or_more",&local_48c,&local_544);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::~opt(&local_540);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
  if (!bVar1) {
    testing::Message::Message(&local_550);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_488);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x79,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_550);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_550);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::opt<>(&local_618);
  psVar3 = pstore::command_line::option::name_abi_cxx11_(&local_618.super_option);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[1],_nullptr>
            ((EqHelper *)local_568,"opt<int> ().name ()","\"\"",psVar3,(char (*) [1])0x1e4e3a);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::~opt(&local_618);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_568);
  if (!bVar1) {
    testing::Message::Message(&local_620);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_568);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x7b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_620);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_620);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_568);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::opt<char[5]>
            (&local_6e8,(char (*) [5])0x1e2100);
  psVar3 = pstore::command_line::option::name_abi_cxx11_(&local_6e8.super_option);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[5],_nullptr>
            ((EqHelper *)local_638,"opt<int>{\"name\"}.name ()","\"name\"",psVar3,
             (char (*) [5])0x1e2100);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::~opt(&local_6e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_638);
  if (!bVar1) {
    testing::Message::Message(&local_6f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_638);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x7c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_6f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_6f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_638);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::opt<>(&local_7b8);
  psVar3 = pstore::command_line::option::description_abi_cxx11_(&local_7b8.super_option);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[1],_nullptr>
            ((EqHelper *)local_708,"opt<int>{}.description ()","\"\"",psVar3,(char (*) [1])0x1e4e3a)
  ;
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::~opt(&local_7b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_708);
  if (!bVar1) {
    testing::Message::Message(&local_7c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_708);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x7e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_7c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_7c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_708);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_8c8,"description",&local_8c9);
  pstore::command_line::desc::desc(&local_8a8,&local_8c8);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::
  opt<pstore::command_line::desc>(&local_888,&local_8a8);
  psVar3 = pstore::command_line::option::description_abi_cxx11_(&local_888.super_option);
  testing::internal::EqHelper::
  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[12],_nullptr>
            ((EqHelper *)local_7d8,"opt<int>{desc (\"description\")}.description ()",
             "\"description\"",psVar3,(char (*) [12])0x1e2442);
  pstore::command_line::opt<int,_pstore::command_line::parser<int,_void>_>::~opt(&local_888);
  pstore::command_line::desc::~desc(&local_8a8);
  std::__cxx11::string::~string((string *)&local_8c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8c9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7d8);
  if (!bVar1) {
    testing::Message::Message(&local_8d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_7d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/command_line/test_cl_parser.cpp"
               ,0x7f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_8e0,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper(&local_8e0);
    testing::Message::~Message(&local_8d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_7d8);
  return;
}

Assistant:

TEST (ClParser, Modifiers) {
    using namespace pstore::command_line;
    EXPECT_EQ (opt<int> ().get_num_occurrences_flag (), num_occurrences_flag::optional);
    EXPECT_EQ (opt<int>{optional}.get_num_occurrences_flag (), num_occurrences_flag::optional);
    EXPECT_EQ (opt<int>{required}.get_num_occurrences_flag (), num_occurrences_flag::required);
    EXPECT_EQ (opt<int>{one_or_more}.get_num_occurrences_flag (),
               num_occurrences_flag::zero_or_more);
    EXPECT_EQ (opt<int> (required, one_or_more).get_num_occurrences_flag (),
               num_occurrences_flag::one_or_more);
    EXPECT_EQ (opt<int> (optional, one_or_more).get_num_occurrences_flag (),
               num_occurrences_flag::zero_or_more);

    EXPECT_EQ (opt<int> ().name (), "");
    EXPECT_EQ (opt<int>{"name"}.name (), "name");

    EXPECT_EQ (opt<int>{}.description (), "");
    EXPECT_EQ (opt<int>{desc ("description")}.description (), "description");
}